

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O2

void __thiscall spvtools::opt::analysis::ArrayConstant::~ArrayConstant(ArrayConstant *this)

{
  CompositeConstant::~CompositeConstant(&this->super_CompositeConstant);
  operator_delete(this,0x28);
  return;
}

Assistant:

ArrayConstant(const Array* ty) : CompositeConstant(ty) {}